

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void com_get_nbr_c(pel *dst,int ipm_c,int ipm,int x,int y,int width,int height,pel *srcT,pel *srcL,
                  int s_src,u16 avail_cu,int scup,com_scu_t *map_scu,int i_scu,int bit_depth)

{
  byte bVar1;
  byte bVar2;
  pel *ppVar3;
  pel pVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  pel *ppVar9;
  pel *__s;
  int local_140;
  int pads;
  int uv_pixel_1;
  int shift_1;
  pel *src;
  com_scu_t *map_left_scu;
  int uv_pixel;
  int shift;
  com_scu_t *map_up_scu;
  int pad_range;
  int default_val;
  int height2;
  int width2;
  int pad_up_in_scu;
  int pad_le_in_scu;
  pel *left;
  pel *up;
  pel *srcTL;
  int height_in_scu;
  int width_in_scu;
  int i;
  int width_local;
  int y_local;
  int x_local;
  int ipm_local;
  int ipm_c_local;
  pel *dst_local;
  s16 *pdst_1;
  int i_2;
  s16 *pdst;
  int i_1;
  
  ppVar3 = srcT;
  ppVar9 = srcT + -2;
  __s = dst + 2;
  _pad_up_in_scu = dst + -2;
  iVar6 = width << 1;
  iVar7 = 1 << ((char)bit_depth - 1U & 0x1f);
  local_140 = width;
  if (width <= height) {
    local_140 = height;
  }
  iVar8 = local_140 * 2 + 4;
  sVar5 = (short)iVar7;
  if ((ipm_c != 2) && ((ipm_c != 0 || (ipm < 0x18)))) {
    if ((avail_cu & 1) == 0) {
      memset(__s,(int)sVar5 & 0xff,(long)(iVar8 * 2));
    }
    else {
      memcpy(__s,srcT,(long)iVar6);
      left = __s + iVar6;
      srcT = srcT + iVar6;
      height_in_scu = 0;
      _uv_pixel = map_scu + (long)(width >> 1) + ((long)scup - (long)i_scu);
      while ((height_in_scu < width >> 1 && (((byte)*_uv_pixel & 1) != 0))) {
        *(undefined4 *)left = *(undefined4 *)srcT;
        height_in_scu = height_in_scu + 1;
        left = left + 4;
        srcT = srcT + 4;
        _uv_pixel = _uv_pixel + 1;
      }
      bVar1 = left[-1];
      bVar2 = left[-2];
      for (pdst._4_4_ = 0; pdst._4_4_ < iVar8 - (width + (height_in_scu << 2) / 2);
          pdst._4_4_ = pdst._4_4_ + 1) {
        *(ushort *)(left + (long)pdst._4_4_ * 2) = (ushort)bVar1 * 0x100 + (ushort)bVar2;
      }
    }
  }
  if ((ipm_c != 3) && (((ipm_c != 0 || (ipm < 3)) || (0xc < ipm)))) {
    if ((avail_cu & 2) == 0) {
      memset(_pad_up_in_scu + (2 - (long)(iVar8 * 2)),(int)sVar5 & 0xff,(long)(iVar8 * 2));
    }
    else {
      src = (pel *)(map_scu + (long)((height >> 1) * i_scu) + (long)scup + -1);
      _uv_pixel_1 = srcL;
      for (height_in_scu = 0; height_in_scu < height; height_in_scu = height_in_scu + 2) {
        *(undefined2 *)_pad_up_in_scu = *(undefined2 *)_uv_pixel_1;
        *(undefined2 *)(_pad_up_in_scu + -2) = *(undefined2 *)(_uv_pixel_1 + s_src);
        _uv_pixel_1 = _uv_pixel_1 + s_src + s_src;
        _pad_up_in_scu = _pad_up_in_scu + -4;
      }
      height_in_scu = 0;
      for (; (height_in_scu < height >> 1 && ((*src & 1) != 0)); src = src + i_scu) {
        *(undefined2 *)_pad_up_in_scu = *(undefined2 *)_uv_pixel_1;
        *(undefined2 *)(_pad_up_in_scu + -2) = *(undefined2 *)(_uv_pixel_1 + s_src);
        _uv_pixel_1 = _uv_pixel_1 + s_src + s_src;
        _pad_up_in_scu = _pad_up_in_scu + -4;
        height_in_scu = height_in_scu + 1;
      }
      bVar1 = _pad_up_in_scu[3];
      bVar2 = _pad_up_in_scu[2];
      iVar6 = (iVar8 - height) - (height_in_scu << 2) / 2;
      for (pdst_1._4_4_ = 0; pdst_1._4_4_ < iVar6; pdst_1._4_4_ = pdst_1._4_4_ + 1) {
        *(ushort *)(_pad_up_in_scu + (long)pdst_1._4_4_ * 2 + (2 - (long)(iVar6 * 2))) =
             (ushort)bVar1 * 0x100 + (ushort)bVar2;
      }
    }
  }
  if ((avail_cu & 4) == 0) {
    if ((avail_cu & 1) == 0) {
      if ((avail_cu & 2) == 0) {
        pVar4 = (pel)iVar7;
        dst[1] = pVar4;
        *dst = pVar4;
      }
      else {
        *dst = *srcL;
        dst[1] = srcL[1];
      }
    }
    else {
      *dst = *ppVar3;
      dst[1] = ppVar3[1];
    }
  }
  else {
    *dst = *ppVar9;
    dst[1] = ppVar3[-1];
  }
  return;
}

Assistant:

void com_get_nbr_c(pel *dst, int ipm_c, int ipm, int x, int y, int width, int height, pel *srcT, pel *srcL, int s_src, u16 avail_cu, int scup, com_scu_t * map_scu, int i_scu, int bit_depth)
{
    int  i;
    int  width_in_scu = width >> (MIN_CU_LOG2 - 1);
    int  height_in_scu = height >> (MIN_CU_LOG2 - 1);
    pel *srcTL = srcT - 2;
    pel *up   = dst + 2;
    pel *left = dst - 2;

    int pad_le_in_scu = height_in_scu;
    int pad_up_in_scu = width_in_scu;

    int width2 = width << 1;
    int height2 = height << 1;
    int default_val = 1 << (bit_depth - 1);
    int pad_range = COM_MAX(width, height) * 2 + 4;

    if (ipm_c != IPD_HOR_C && (ipm_c != IPD_DM_C || ipm < IPD_HOR)) {
        if (IS_AVAIL(avail_cu, AVAIL_UP)) {
            com_scu_t *map_up_scu = map_scu + scup - i_scu + width_in_scu;

            memcpy(up, srcT, width2 * sizeof(pel));
            up += width2, srcT += width2;

            for (i = 0; i < pad_up_in_scu; i++, up += MIN_CU_SIZE, srcT += MIN_CU_SIZE) {
                if ((map_up_scu++)->coded) {
                    com_mcpy_4pel(up, srcT);
                } else {
                    break;
                }
            }
            const int shift = sizeof(pel) * 8;
            int uv_pixel = (up[-1] << shift) + up[-2];
            com_mset_2pel(up, uv_pixel, pad_range - (width + i * MIN_CU_SIZE / 2));
        } else {
            com_mset_pel(up, default_val, pad_range << 1);
        }
    }
    if (ipm_c != IPD_VER_C && (ipm_c != IPD_DM_C || ipm <= IPD_BI || ipm > IPD_VER)) {
        if (IS_AVAIL(avail_cu, AVAIL_LE)) {
            com_scu_t *map_left_scu = map_scu + scup - 1 + height_in_scu * i_scu;
            pel *src = srcL;

            for (i = 0; i < height; i+=2) {
                com_mcpy_2pel(left, src); src += s_src; left -= 2;
                com_mcpy_2pel(left, src); src += s_src; left -= 2;
            }
            for (i = 0; i < pad_le_in_scu; i++, map_left_scu += i_scu) {
                if (map_left_scu->coded) {
                    com_mcpy_2pel(left, src); src += s_src; left -= 2;
                    com_mcpy_2pel(left, src); src += s_src; left -= 2;
                } else {
                    break;
                }
            }

            const int shift = sizeof(pel) * 8;
            int uv_pixel = (left[3] << shift) + left[2];
            int pads = pad_range - height - i * MIN_CU_SIZE / 2;
            com_mset_2pel(left - pads * 2 + 2, uv_pixel, pads);
        } else {
            com_mset_pel(left - (pad_range << 1) + 2, default_val, pad_range << 1);
        }
    }
    if (IS_AVAIL(avail_cu, AVAIL_UL)) {
        dst[0] = srcTL[0];
        dst[1] = srcTL[1];
    } else if (IS_AVAIL(avail_cu, AVAIL_UP)) {
        dst[0] = srcTL[2];
        dst[1] = srcTL[3];
    } else if (IS_AVAIL(avail_cu, AVAIL_LE)) {
        dst[0] = srcL[0];
        dst[1] = srcL[1];
    } else {
        dst[0] = dst[1] = default_val;
    }
}